

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix2 * matrix2_multiply(matrix2 *self,matrix2 *mT)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float afVar5 [2];
  float afVar6 [2];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  afVar5 = (self->field_0).field_1.m22[0];
  afVar6 = (self->field_0).field_1.m22[1];
  fVar1 = (mT->field_0).m[0];
  fVar2 = (mT->field_0).m[1];
  fVar3 = (mT->field_0).m[2];
  fVar7 = afVar5[0];
  fVar8 = afVar5[1];
  fVar4 = (mT->field_0).m[3];
  fVar9 = afVar6[0];
  fVar10 = afVar6[1];
  (self->field_0).m[0] = fVar2 * fVar9 + fVar1 * fVar7;
  (self->field_0).m[1] = fVar2 * fVar10 + fVar1 * fVar8;
  (self->field_0).m[2] = fVar4 * fVar9 + fVar3 * fVar7;
  (self->field_0).m[3] = fVar4 * fVar10 + fVar3 * fVar8;
  return self;
}

Assistant:

HYPAPI struct matrix2 *matrix2_multiply(struct matrix2 *self, const struct matrix2 *mT)
{
	/* mT is the multiplicand */

	struct matrix2 r;

	matrix2_identity(&r);

	/* first row */
	r.r00 = self->c00 * mT->c00 + self->c01 * mT->c10;
	r.r01 = self->c10 * mT->c00 + self->c11 * mT->c10;

	/* second row */
	r.r10 = self->c00 * mT->c01 + self->c01 * mT->c11;
	r.r11 = self->c10 * mT->c01 + self->c11 * mT->c11;

	matrix2_set(self, &r); /* overwrite/save it */

	return self;
}